

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O2

void __thiscall
mocker::ir::Call::Call<std::shared_ptr<mocker::ir::Addr>>
          (Call *this,string *funcName,shared_ptr<mocker::ir::Addr> *args)

{
  initializer_list<std::shared_ptr<mocker::ir::Addr>_> __l;
  allocator_type local_49;
  shared_ptr<mocker::ir::Addr> local_48;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__IRInst_001efc48;
  (this->super_IRInst).type = Call;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Definition_001efc68;
  (this->super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_001f08a0;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_001f08c0;
  std::__cxx11::string::string((string *)&this->funcName,(string *)funcName);
  local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  __l._M_len = 1;
  __l._M_array = &local_48;
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  vector(&this->args,__l,&local_49);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

explicit Call(std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(nullptr),
        funcName(std::move(funcName)), args({std::move(args)...}) {}